

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_markdown_generator.cc
# Opt level: O0

int __thiscall t_markdown_generator::print_type(t_markdown_generator *this,t_type *ttype)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  t_type *ptVar5;
  ulong uVar6;
  t_program *ptVar7;
  string *psVar8;
  string *psVar9;
  ostream *poVar10;
  long lVar11;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  undefined1 local_98 [8];
  string type_name;
  string prog_name;
  allocator local_41;
  string local_40 [32];
  long local_20;
  size_type len;
  t_type *ttype_local;
  t_markdown_generator *this_local;
  
  local_20 = 0;
  len = (size_type)ttype;
  ttype_local = (t_type *)this;
  uVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xd])();
  if ((uVar3 & 1) == 0) {
    uVar6 = (**(code **)(*(long *)len + 0x28))();
    if ((uVar6 & 1) == 0) {
      ptVar7 = t_type::get_program((t_type *)len);
      psVar8 = t_program::get_name_abi_cxx11_(ptVar7);
      std::__cxx11::string::string((string *)(type_name.field_2._M_local_buf + 8),(string *)psVar8);
      psVar9 = (string *)(**(code **)(*(long *)len + 0x18))();
      std::__cxx11::string::string((string *)local_98,psVar9);
      poVar10 = std::operator<<((ostream *)&this->f_out_,"[```");
      poVar10 = std::operator<<(poVar10,(string *)local_98);
      poVar10 = std::operator<<(poVar10,"```](");
      std::__cxx11::string::string
                ((string *)&local_f8,(string *)(type_name.field_2._M_local_buf + 8));
      make_file_name(&local_d8,this,&local_f8);
      make_file_link(&local_b8,this,&local_d8);
      poVar10 = std::operator<<(poVar10,(string *)&local_b8);
      std::operator<<(poVar10,"#");
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_f8);
      bVar1 = (**(code **)(*(long *)len + 0x48))();
      if ((bVar1 & 1) == 0) {
        bVar1 = (**(code **)(*(long *)len + 0x60))();
        if ((bVar1 & 1) == 0) {
          bVar1 = (**(code **)(*(long *)len + 0x58))();
          if ((bVar1 & 1) == 0) {
            bVar1 = (**(code **)(*(long *)len + 0x50))();
            if ((bVar1 & 1) == 0) {
              bVar1 = (**(code **)(*(long *)len + 0x88))();
              if ((bVar1 & 1) != 0) {
                std::operator<<((ostream *)&this->f_out_,"service-");
              }
            }
            else {
              std::operator<<((ostream *)&this->f_out_,"enumeration-");
            }
          }
          else {
            bVar2 = t_struct::is_union((t_struct *)len);
            if (bVar2) {
              std::operator<<((ostream *)&this->f_out_,"union-");
            }
            else {
              std::operator<<((ostream *)&this->f_out_,"struct-");
            }
          }
        }
        else {
          std::operator<<((ostream *)&this->f_out_,"exception-");
        }
      }
      else {
        std::operator<<((ostream *)&this->f_out_,"typedef-");
      }
      local_20 = std::__cxx11::string::size();
      ptVar7 = t_type::get_program((t_type *)len);
      if (ptVar7 != (this->super_t_generator).program_) {
        str_to_id(&local_118,this,(string *)((long)&type_name.field_2 + 8));
        std::operator<<((ostream *)&this->f_out_,(string *)&local_118);
        std::__cxx11::string::~string((string *)&local_118);
        lVar11 = std::__cxx11::string::size();
        local_20 = lVar11 + 1 + local_20;
      }
      str_to_id(&local_138,this,(string *)local_98);
      poVar10 = std::operator<<((ostream *)&this->f_out_,(string *)&local_138);
      std::operator<<(poVar10,')');
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)local_98);
      std::__cxx11::string::~string((string *)(type_name.field_2._M_local_buf + 8));
    }
    else {
      poVar10 = std::operator<<((ostream *)&this->f_out_,"```");
      uVar6 = (**(code **)(*(long *)len + 0x38))();
      bVar2 = (uVar6 & 1) != 0;
      if (bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_40,"binary",&local_41);
      }
      else {
        psVar9 = (string *)(**(code **)(*(long *)len + 0x18))();
        std::__cxx11::string::string(local_40,psVar9);
      }
      poVar10 = std::operator<<(poVar10,local_40);
      std::operator<<(poVar10,"```");
      std::__cxx11::string::~string(local_40);
      if (bVar2) {
        std::allocator<char>::~allocator((allocator<char> *)&local_41);
      }
      (**(code **)(*(long *)len + 0x18))();
      local_20 = std::__cxx11::string::size();
    }
  }
  else {
    uVar6 = (**(code **)(*(long *)len + 0x70))();
    if ((uVar6 & 1) == 0) {
      uVar6 = (**(code **)(*(long *)len + 0x78))();
      if ((uVar6 & 1) == 0) {
        uVar6 = (**(code **)(*(long *)len + 0x80))();
        if ((uVar6 & 1) != 0) {
          std::operator<<((ostream *)&this->f_out_,"map&lt;");
          ptVar5 = t_map::get_key_type((t_map *)len);
          iVar4 = print_type(this,ptVar5);
          local_20 = (long)(iVar4 + 5);
          std::operator<<((ostream *)&this->f_out_,", ");
          ptVar5 = t_map::get_val_type((t_map *)len);
          iVar4 = print_type(this,ptVar5);
          local_20 = iVar4 + local_20;
          std::operator<<((ostream *)&this->f_out_,"&gt;");
        }
      }
      else {
        std::operator<<((ostream *)&this->f_out_,"set&lt;");
        ptVar5 = t_set::get_elem_type((t_set *)len);
        iVar4 = print_type(this,ptVar5);
        local_20 = (long)(iVar4 + 5);
        std::operator<<((ostream *)&this->f_out_,"&gt;");
      }
    }
    else {
      std::operator<<((ostream *)&this->f_out_,"list&lt;");
      ptVar5 = t_list::get_elem_type((t_list *)len);
      iVar4 = print_type(this,ptVar5);
      local_20 = (long)(iVar4 + 6);
      std::operator<<((ostream *)&this->f_out_,"&gt;");
    }
  }
  return (int)local_20;
}

Assistant:

int t_markdown_generator::print_type(t_type* ttype) {
  std::string::size_type len = 0;
  if (ttype->is_container()) {
    if (ttype->is_list()) {
      f_out_ << "list&lt;";
      len = 6 + print_type(((t_list*)ttype)->get_elem_type());
      f_out_ << "&gt;";
    } else if (ttype->is_set()) {
      f_out_ << "set&lt;";
      len = 5 + print_type(((t_set*)ttype)->get_elem_type());
      f_out_ << "&gt;";
    } else if (ttype->is_map()) {
      f_out_ << "map&lt;";
      len = 5 + print_type(((t_map*)ttype)->get_key_type());
      f_out_ << ", ";
      len += print_type(((t_map*)ttype)->get_val_type());
      f_out_ << "&gt;";
    }
  } else if (ttype->is_base_type()) {
    f_out_ << "```" << (ttype->is_binary() ? "binary" : ttype->get_name()) 
           << "```";
    len = ttype->get_name().size();
  } else {
    string prog_name = ttype->get_program()->get_name();
    string type_name = ttype->get_name();
    f_out_ << "[```" << type_name << "```](" 
           << make_file_link(make_file_name(prog_name)) << "#";
    if (ttype->is_typedef()) {
      f_out_ << "typedef-";
    } else if (ttype->is_xception()) {
      f_out_ << "exception-";
    } else if (ttype->is_struct()) {
      if(((t_struct*)ttype)->is_union())
        f_out_ << "union-";
      else
        f_out_ << "struct-";
    } else if (ttype->is_enum()) {
      f_out_ << "enumeration-";
    } else if (ttype->is_service()) {
      f_out_ << "service-";
    }
    len = type_name.size();
    if (ttype->get_program() != program_) {
      f_out_ << str_to_id(prog_name); 
      len += prog_name.size() + 1;
    }
    f_out_ <<  str_to_id(type_name) << ')';
  }
  return (int)len;
}